

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * backward::SignalHandling::make_default_signals(void)

{
  vector<int,std::allocator<int>> *in_RDI;
  int posix_signals [11];
  allocator_type local_39;
  int local_38 [12];
  
  local_38[8] = 5;
  local_38[9] = 0x18;
  local_38[10] = 0x19;
  local_38[4] = 6;
  local_38[5] = 3;
  local_38[6] = 0xb;
  local_38[7] = 0x1f;
  local_38[0] = 6;
  local_38[1] = 7;
  local_38[2] = 8;
  local_38[3] = 4;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            (in_RDI,local_38,local_38 + 0xb,&local_39);
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

static std::vector<int> make_default_signals() {
    const int posix_signals[] = {
      // Signals for which the default action is "Core".
      SIGABRT, // Abort signal from abort(3)
      SIGBUS,  // Bus error (bad memory access)
      SIGFPE,  // Floating point exception
      SIGILL,  // Illegal Instruction
      SIGIOT,  // IOT trap. A synonym for SIGABRT
      SIGQUIT, // Quit from keyboard
      SIGSEGV, // Invalid memory reference
      SIGSYS,  // Bad argument to routine (SVr4)
      SIGTRAP, // Trace/breakpoint trap
      SIGXCPU, // CPU time limit exceeded (4.2BSD)
      SIGXFSZ, // File size limit exceeded (4.2BSD)
#if defined(BACKWARD_SYSTEM_DARWIN)
      SIGEMT, // emulation instruction executed
#endif
    };
    return std::vector<int>(posix_signals,
                            posix_signals +
                                sizeof posix_signals / sizeof posix_signals[0]);
  }